

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to4_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  short *k30;
  short *k20;
  short *k10;
  short *k00;
  int i_2;
  int p_1;
  short *g00;
  int k;
  Mat kernel_tm_1;
  Mat k3;
  Mat k2_1;
  Mat k1_1;
  Mat k0_1;
  int q;
  int i_1;
  short *tmpp;
  int j;
  int i;
  short tmp [6] [3];
  char *k2;
  char *k1;
  char *k0;
  short *kernel_tm0;
  char *kernel0;
  int q_1;
  int p;
  short ktm [6] [3];
  Mat kernel_tm;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff720;
  int _elempack;
  size_t in_stack_fffffffffffff728;
  undefined8 in_stack_fffffffffffff730;
  int _c;
  undefined8 in_stack_fffffffffffff738;
  Mat *in_stack_fffffffffffff740;
  Allocator *in_stack_fffffffffffff7a0;
  int local_7f0;
  int local_7ec;
  undefined2 *local_7e8;
  int local_7dc;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined4 local_7c0;
  long local_7b8;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined8 local_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined4 local_778;
  long *local_770;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined8 local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined4 local_730;
  long *local_728;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined8 local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined4 local_6e8;
  long *local_6e0;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  undefined8 local_6c0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined4 local_6a0;
  long *local_698;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined4 local_684;
  undefined4 local_680;
  undefined8 local_678;
  int local_670;
  int local_66c;
  short *local_668;
  int local_660;
  int local_65c;
  short local_658 [20];
  char *local_630;
  char *local_628;
  char *local_620;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined4 local_5f0;
  long *local_5e8;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined8 local_5c8;
  void *local_5c0;
  char *local_5b8;
  int local_5b0;
  int local_5ac;
  short local_5a8 [24];
  void *local_578;
  int *local_570;
  long local_568;
  undefined4 local_560;
  long *local_558;
  undefined4 local_550;
  int local_54c;
  int local_548;
  undefined4 local_544;
  undefined4 local_540;
  long local_538;
  int local_528;
  int local_524;
  long *local_520;
  long *local_518;
  undefined1 local_50d;
  int local_50c;
  undefined8 *local_500;
  undefined1 local_4f5;
  int local_4f4;
  void **local_4f0;
  undefined8 *local_4e8;
  undefined1 local_4dd;
  int local_4dc;
  void **local_4d8;
  undefined8 *local_4d0;
  undefined1 local_4c5;
  int local_4c4;
  void **local_4c0;
  undefined8 *local_4b8;
  undefined1 local_4ad;
  int local_4ac;
  void **local_4a8;
  undefined8 *local_4a0;
  undefined1 local_495;
  int local_494;
  void **local_490;
  undefined8 *local_488;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 *local_430;
  undefined8 *local_420;
  undefined8 *local_410;
  void **local_400;
  long *local_3e8;
  undefined4 local_3dc;
  long local_3d8;
  void *local_3d0;
  undefined4 local_3c4;
  int local_3c0;
  int local_3bc;
  undefined8 *local_3b8;
  long *local_3b0;
  undefined4 local_3a4;
  long local_3a0;
  void *local_398;
  undefined4 local_38c;
  int local_388;
  int local_384;
  undefined8 *local_380;
  long *local_378;
  undefined4 local_36c;
  long local_368;
  void *local_360;
  undefined4 local_354;
  int local_350;
  int local_34c;
  undefined8 *local_348;
  long *local_340;
  undefined4 local_334;
  long local_330;
  void *local_328;
  undefined4 local_31c;
  int local_318;
  int local_314;
  undefined8 *local_310;
  long *local_308;
  undefined4 local_2fc;
  long local_2f8;
  void *local_2f0;
  undefined4 local_2e4;
  int local_2e0;
  int local_2dc;
  undefined8 *local_2d8;
  long local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  long local_2b8;
  undefined4 local_2ac;
  int local_2a8;
  int local_2a4;
  undefined8 *local_2a0;
  undefined4 local_294;
  long local_290;
  undefined4 local_284;
  long local_280;
  undefined4 local_274;
  long local_270;
  undefined4 local_264;
  long local_260;
  undefined4 local_254;
  long local_250;
  undefined4 local_244;
  long local_240;
  int local_228;
  undefined4 local_224;
  void **local_220;
  undefined8 *local_200;
  undefined8 *local_1e0;
  undefined8 *local_1c0;
  undefined8 *local_1a0;
  undefined8 *local_190;
  undefined8 *local_180;
  void *local_98;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_6c;
  void **local_68;
  int local_5c;
  undefined8 *local_58;
  int local_4c;
  undefined8 *local_48;
  int local_3c;
  undefined8 *local_38;
  int local_2c;
  undefined8 *local_28;
  int local_1c;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffff730 >> 0x20);
  local_68 = &local_578;
  local_6c = 0x24;
  local_80 = 2;
  local_88 = 0;
  local_578 = (void *)0x0;
  local_570 = (int *)0x0;
  local_568 = 0;
  local_560 = 0;
  local_558 = (long *)0x0;
  local_550 = 0;
  local_54c = 0;
  local_548 = 0;
  local_544 = 0;
  local_540 = 0;
  local_538 = 0;
  local_528 = in_ECX;
  local_524 = in_EDX;
  local_520 = in_RSI;
  local_518 = in_RDI;
  Mat::create(in_stack_fffffffffffff740,(int)((ulong)in_stack_fffffffffffff738 >> 0x20),
              (int)in_stack_fffffffffffff738,_c,in_stack_fffffffffffff728,in_stack_fffffffffffff720)
  ;
  _elempack = (int)((ulong)in_stack_fffffffffffff720 >> 0x20);
  memcpy(local_5a8,&DAT_01f075b0,0x24);
  for (local_5ac = 0; local_5ac < local_528; local_5ac = local_5ac + 1) {
    for (local_5b0 = 0; local_5b0 < local_524; local_5b0 = local_5b0 + 1) {
      local_620 = (char *)(*local_518 + (long)(local_5ac * local_524 * 9) + (long)(local_5b0 * 9));
      local_488 = &local_608;
      local_490 = &local_578;
      local_3d0 = (void *)((long)local_578 + local_538 * local_5ac * local_568);
      local_3b8 = &local_608;
      local_240 = (long)local_54c * (long)local_548 * local_568;
      local_5e8 = local_558;
      local_244 = 0x10;
      local_3bc = local_54c;
      local_3c0 = local_548;
      local_3c4 = local_544;
      local_3d8 = local_568;
      local_3dc = local_560;
      local_3e8 = local_558;
      local_494 = local_5ac;
      local_495 = 1;
      local_48 = &local_608;
      local_4c = local_5b0;
      local_5c0 = (void *)((long)local_3d0 + (long)local_54c * (long)local_5b0 * local_568);
      local_450 = &local_608;
      local_608 = 0;
      local_5f8 = 0;
      local_5f0 = 0;
      local_5e0 = 0;
      local_5dc = 0;
      local_5d8 = 0;
      local_5d4 = 0;
      local_5d0 = 0;
      local_5c8 = 0;
      local_600 = 0;
      local_628 = local_620 + 3;
      local_630 = local_620 + 6;
      for (local_65c = 0; local_65c < 6; local_65c = local_65c + 1) {
        local_658[(long)local_65c * 3] =
             (short)*local_620 * local_5a8[(long)local_65c * 3] +
             (short)local_620[1] * local_5a8[(long)local_65c * 3 + 1] +
             (short)local_620[2] * local_5a8[(long)local_65c * 3 + 2];
        local_658[(long)local_65c * 3 + 1] =
             (short)*local_628 * local_5a8[(long)local_65c * 3] +
             (short)local_620[4] * local_5a8[(long)local_65c * 3 + 1] +
             (short)local_620[5] * local_5a8[(long)local_65c * 3 + 2];
        local_658[(long)local_65c * 3 + 2] =
             (short)*local_630 * local_5a8[(long)local_65c * 3] +
             (short)local_620[7] * local_5a8[(long)local_65c * 3 + 1] +
             (short)local_620[8] * local_5a8[(long)local_65c * 3 + 2];
      }
      for (local_660 = 0; local_660 < 6; local_660 = local_660 + 1) {
        lVar1 = (long)local_660;
        local_668 = local_658 + lVar1 * 3;
        for (local_66c = 0; local_66c < 6; local_66c = local_66c + 1) {
          *(short *)((long)local_5c0 + (long)(local_660 * 6 + local_66c) * 2) =
               *local_668 * local_5a8[(long)local_66c * 3] +
               local_658[lVar1 * 3 + 1] * local_5a8[(long)local_66c * 3 + 1] +
               local_658[lVar1 * 3 + 2] * local_5a8[(long)local_66c * 3 + 2];
        }
      }
      local_5b8 = local_620;
      local_180 = local_450;
    }
  }
  Mat::create(in_stack_fffffffffffff740,(int)((ulong)in_stack_fffffffffffff738 >> 0x20),
              (int)in_stack_fffffffffffff738,_c,in_stack_fffffffffffff728,_elempack,
              in_stack_fffffffffffff7a0);
  for (local_670 = 0; local_670 + 3 < local_528; local_670 = local_670 + 4) {
    local_4a0 = &local_6b8;
    local_4a8 = &local_578;
    local_398 = (void *)((long)local_578 + local_538 * local_670 * local_568);
    local_380 = &local_6b8;
    local_250 = (long)local_54c * (long)local_548 * local_568;
    local_4c4 = local_670 + 1;
    local_4b8 = &local_700;
    local_4c0 = &local_578;
    local_360 = (void *)((long)local_578 + local_538 * local_4c4 * local_568);
    local_348 = &local_700;
    local_260 = (long)local_54c * (long)local_548 * local_568;
    local_4dc = local_670 + 2;
    local_4d0 = &local_748;
    local_4d8 = &local_578;
    local_328 = (void *)((long)local_578 + local_538 * local_4dc * local_568);
    local_310 = &local_748;
    local_270 = (long)local_54c * (long)local_548 * local_568;
    local_4f4 = local_670 + 3;
    local_4e8 = &local_790;
    local_4f0 = &local_578;
    local_2f0 = (void *)((long)local_578 + local_538 * local_4f4 * local_568);
    local_2d8 = &local_790;
    local_280 = (long)local_54c * (long)local_548 * local_568;
    local_50c = local_670 / 4;
    local_500 = &local_7d8;
    local_2a4 = *(int *)((long)local_520 + 0x2c);
    local_2a8 = (int)local_520[6];
    local_2ac = *(undefined4 *)((long)local_520 + 0x34);
    local_2b8 = *local_520 + local_520[8] * (long)local_50c * local_520[2];
    local_2c0 = local_520[2];
    local_2c4 = (undefined4)local_520[3];
    local_2d0 = local_520[4];
    local_2a0 = &local_7d8;
    local_290 = (long)local_2a4 * (long)local_2a8 * local_2c0;
    for (local_7dc = 0; local_7dc < 0x24; local_7dc = local_7dc + 1) {
      local_58 = &local_7d8;
      local_5c = local_7dc;
      local_7e8 = (undefined2 *)(local_2b8 + (long)local_2a4 * (long)local_7dc * local_2c0);
      for (local_7ec = 0; local_7ec + 7 < local_524; local_7ec = local_7ec + 8) {
        for (local_7f0 = 0; local_7f0 < 8; local_7f0 = local_7f0 + 1) {
          local_c = local_7ec + local_7f0;
          local_8 = &local_6b8;
          local_1c = local_7ec + local_7f0;
          local_18 = &local_700;
          local_2c = local_7ec + local_7f0;
          local_28 = &local_748;
          local_3c = local_7ec + local_7f0;
          local_38 = &local_790;
          *local_7e8 = *(undefined2 *)
                        ((long)local_398 +
                        (long)local_7dc * 2 + (long)local_54c * (long)local_c * local_568);
          local_7e8[1] = *(undefined2 *)
                          ((long)local_360 +
                          (long)local_7dc * 2 + (long)local_54c * (long)local_1c * local_568);
          local_7e8[2] = *(undefined2 *)
                          ((long)local_328 +
                          (long)local_7dc * 2 + (long)local_54c * (long)local_2c * local_568);
          local_7e8[3] = *(undefined2 *)
                          ((long)local_2f0 +
                          (long)local_7dc * 2 + (long)local_54c * (long)local_3c * local_568);
          local_7e8 = local_7e8 + 4;
        }
      }
    }
    local_448 = &local_7d8;
    local_440 = &local_790;
    local_430 = &local_748;
    local_420 = &local_700;
    local_6e0 = local_558;
    local_710 = 0;
    local_714 = 0;
    local_718 = 0;
    local_71c = 0;
    local_728 = local_558;
    local_730 = 0;
    local_738 = 0;
    local_740 = 0;
    local_748 = 0;
    local_758 = 0;
    local_75c = 0;
    local_760 = 0;
    local_764 = 0;
    local_770 = local_558;
    local_778 = 0;
    local_780 = 0;
    local_788 = 0;
    local_790 = 0;
    local_7a0 = 0;
    local_7a4 = 0;
    local_7a8 = 0;
    local_7ac = 0;
    local_7c0 = 0;
    local_7c8 = 0;
    local_7d0 = 0;
    local_7d8 = 0;
    local_708 = 0;
    local_720 = 0;
    local_750 = 0;
    local_768 = 0;
    local_798 = 0;
    local_7b0 = 0;
    local_700 = 0;
    local_6f0 = 0;
    local_6e8 = 0;
    local_6d8 = 0;
    local_6d4 = 0;
    local_6d0 = 0;
    local_6cc = 0;
    local_6c8 = 0;
    local_6c0 = 0;
    local_6f8 = 0;
    local_410 = &local_6b8;
    local_698 = local_558;
    local_254 = 0x10;
    local_264 = 0x10;
    local_274 = 0x10;
    local_284 = 0x10;
    local_294 = 0x10;
    local_2dc = local_54c;
    local_2e0 = local_548;
    local_2e4 = local_544;
    local_2f8 = local_568;
    local_2fc = local_560;
    local_308 = local_558;
    local_314 = local_54c;
    local_318 = local_548;
    local_31c = local_544;
    local_330 = local_568;
    local_334 = local_560;
    local_340 = local_558;
    local_34c = local_54c;
    local_350 = local_548;
    local_354 = local_544;
    local_368 = local_568;
    local_36c = local_560;
    local_378 = local_558;
    local_384 = local_54c;
    local_388 = local_548;
    local_38c = local_544;
    local_3a0 = local_568;
    local_3a4 = local_560;
    local_3b0 = local_558;
    local_4ac = local_670;
    local_4ad = 1;
    local_4c5 = 1;
    local_4dd = 1;
    local_4f5 = 1;
    local_50d = 1;
    local_6b8 = 0;
    local_6a8 = 0;
    local_6a0 = 0;
    local_690 = 0;
    local_68c = 0;
    local_688 = 0;
    local_684 = 0;
    local_680 = 0;
    local_678 = 0;
    local_6b0 = 0;
    local_200 = local_410;
    local_1e0 = local_420;
    local_1c0 = local_430;
    local_1a0 = local_440;
    local_190 = local_448;
    local_7b8 = local_2d0;
  }
  local_400 = &local_578;
  if (local_570 != (int *)0x0) {
    local_224 = 0xffffffff;
    LOCK();
    local_228 = *local_570;
    *local_570 = *local_570 + -1;
    UNLOCK();
    if (local_228 == 1) {
      local_220 = local_400;
      if (local_558 == (long *)0x0) {
        local_98 = local_578;
        if (local_578 != (void *)0x0) {
          free(local_578);
        }
      }
      else {
        (**(code **)(*local_558 + 0x18))(local_558,local_578);
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx512vnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avxvnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif
#endif

    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch, (size_t)2u);

    const short ktm[6][3] = {
        {6, 0, 0},
        {-4, -4, -4},
        {-4, 4, -4},
        {1, 2, 4},
        {1, -2, 4},
        {0, 0, 6}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 4b-8a-inch/8a-36-outch/4b
    kernel_tm_pack8.create(inch / 8, 36, outch / 4, (size_t)2u * 32, 32);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel_tm.channel(q);
        const Mat k1 = kernel_tm.channel(q + 1);
        const Mat k2 = kernel_tm.channel(q + 2);
        const Mat k3 = kernel_tm.channel(q + 3);

        Mat kernel_tm = kernel_tm_pack8.channel(q / 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = kernel_tm.row<short>(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
#if __AVXVNNI__ || __AVX512VNNI__ || __XOP__
                for (int i = 0; i < 4; i++)
                {
                    const short* k00 = k0.row<const short>(p + i * 2);
                    const short* k10 = k1.row<const short>(p + i * 2);
                    const short* k20 = k2.row<const short>(p + i * 2);
                    const short* k30 = k3.row<const short>(p + i * 2);

                    const short* k01 = k0.row<const short>(p + i * 2 + 1);
                    const short* k11 = k1.row<const short>(p + i * 2 + 1);
                    const short* k21 = k2.row<const short>(p + i * 2 + 1);
                    const short* k31 = k3.row<const short>(p + i * 2 + 1);

                    g00[0] = k00[k];
                    g00[1] = k01[k];
                    g00[2] = k10[k];
                    g00[3] = k11[k];
                    g00[4] = k20[k];
                    g00[5] = k21[k];
                    g00[6] = k30[k];
                    g00[7] = k31[k];

                    g00 += 8;
                }
#else
                for (int i = 0; i < 8; i++)
                {
                    const short* k00 = k0.row<const short>(p + i);
                    const short* k10 = k1.row<const short>(p + i);
                    const short* k20 = k2.row<const short>(p + i);
                    const short* k30 = k3.row<const short>(p + i);

                    g00[0] = k00[k];
                    g00[1] = k10[k];
                    g00[2] = k20[k];
                    g00[3] = k30[k];

                    g00 += 4;
                }
#endif
            }
        }
    }
}